

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_simplex_node(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  byte bVar2;
  uint uVar3;
  REF_CELL *ppRVar4;
  long lVar5;
  
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    ppRVar4 = ref_grid->cell + 8;
  }
  else {
    ppRVar4 = ref_grid->cell + 3;
  }
  ref_node = ref_grid->node;
  pRVar1 = *ppRVar4;
  lVar5 = 0;
  bVar2 = 0;
  do {
    if (ref_node->max <= lVar5) {
      return (uint)bVar2;
    }
    if ((-1 < ref_node->global[lVar5]) &&
       ((pRVar1->ref_adj->nnode <= lVar5 || (pRVar1->ref_adj->first[lVar5] == -1)))) {
      uVar3 = ref_node_location(ref_node,(REF_INT)lVar5);
      bVar2 = 1;
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x2e,"ref_validation_simplex_node",(ulong)uVar3,"location");
        return uVar3;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_simplex_node(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_BOOL problem;

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  problem = REF_FALSE;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_cell_node_empty(ref_cell, node)) {
      problem = REF_TRUE;
      RSS(ref_node_location(ref_node, node), "location");
    }
  }

  return (problem ? REF_FAILURE : REF_SUCCESS);
}